

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::BIT(m6502 *this)

{
  byte bVar1;
  uint16_t tmp;
  m6502 *this_local;
  
  fetch(this);
  bVar1 = this->a & this->fetched;
  SetFlag(this,Z,bVar1 == 0);
  SetFlag(this,N,(bVar1 & 0x80) != 0);
  SetFlag(this,V,(this->fetched & 0x40) != 0);
  return '\0';
}

Assistant:

uint8_t BIT()
  {
    fetch();
    uint16_t tmp = a & fetched;
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    SetFlag(V, fetched & (1 << 6));
    return 0;
  }